

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<int,_8UL>::small_vector
          (small_vector<int,_8UL> *this,initializer_list<int> init)

{
  initializer_list<int> __ils;
  initializer_list<int> __ils_00;
  size_type new_cap;
  int *__first;
  int *__last;
  back_insert_iterator<pstore::small_vector<int,_8UL>_> __result;
  small_vector<int,_8UL> *this_local;
  initializer_list<int> init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = (small_vector<int,_8UL> *)init._M_array;
  small_vector(this);
  new_cap = std::initializer_list<int>::size((initializer_list<int> *)&this_local);
  reserve(this,new_cap);
  __ils_00._M_len = (size_type)init_local._M_array;
  __ils_00._M_array = (iterator)this_local;
  __first = std::begin<int>(__ils_00);
  __ils._M_len = (size_type)init_local._M_array;
  __ils._M_array = (iterator)this_local;
  __last = std::end<int>(__ils);
  __result = std::back_inserter<pstore::small_vector<int,8ul>>(this);
  std::copy<int_const*,std::back_insert_iterator<pstore::small_vector<int,8ul>>>
            (__first,__last,__result);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }